

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O0

int32_t __thiscall icu_63::ChineseCalendar::handleGetExtendedYear(ChineseCalendar *this)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t local_14;
  int32_t cycle;
  int32_t year;
  ChineseCalendar *this_local;
  
  iVar1 = Calendar::newestStamp(&this->super_Calendar,UCAL_ERA,UCAL_YEAR,0);
  if ((this->super_Calendar).fStamp[0x13] < iVar1) {
    iVar1 = Calendar::internalGet(&this->super_Calendar,UCAL_ERA,1);
    iVar2 = Calendar::internalGet(&this->super_Calendar,UCAL_YEAR,1);
    local_14 = ((iVar1 + -1) * 0x3c + iVar2) - (*(int *)&(this->super_Calendar).field_0x264 + 0xa4c)
    ;
  }
  else {
    local_14 = Calendar::internalGet(&this->super_Calendar,UCAL_EXTENDED_YEAR,1);
  }
  return local_14;
}

Assistant:

int32_t ChineseCalendar::handleGetExtendedYear() {
    int32_t year;
    if (newestStamp(UCAL_ERA, UCAL_YEAR, kUnset) <= fStamp[UCAL_EXTENDED_YEAR]) {
        year = internalGet(UCAL_EXTENDED_YEAR, 1); // Default to year 1
    } else {
        int32_t cycle = internalGet(UCAL_ERA, 1) - 1; // 0-based cycle
        // adjust to the instance specific epoch
        year = cycle * 60 + internalGet(UCAL_YEAR, 1) - (fEpochYear - CHINESE_EPOCH_YEAR);
    }
    return year;
}